

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O3

enable_if_t<isTupleLikeV<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_bool>
 matchit::impl::
 PatternTraits<matchit::impl::App<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>(&)(mathiu::impl::Expr_const&),matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>>>
 ::
 matchPatternImpl<mathiu::impl::Expr_const&,matchit::impl::Context<int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Product_const*,bool,mathiu::impl::Product_const*,bool,mathiu::impl::Product_const*,bool,mathiu::impl::Product_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Power_const*,bool,mathiu::impl::Power_const*,bool,mathiu::impl::PieceWise_const*,bool,mathiu::impl::PieceWise_const*,bool,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>>>
           (Expr *value,
           App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
           *appPat,int32_t depth,
           Context<const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Product_*,_bool,_const_mathiu::impl::Product_*,_bool,_const_mathiu::impl::Product_*,_bool,_const_mathiu::impl::Product_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::Power_*,_bool,_const_mathiu::impl::Power_*,_bool,_const_mathiu::impl::PieceWise_*,_bool,_const_mathiu::impl::PieceWise_*,_bool,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
           *context)

{
  enable_if_t<isTupleLikeV<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_bool>
  eVar1;
  variant_alternative_t<7UL,_variant<monostate,_const_Product_*,_const_int_*,_const_Fraction_*,_const_Power_*,_const_PieceWise_*,_bool,_pair<shared_ptr<const_Expr>,_shared_ptr<const_Expr>_>_>_>
  *value_00;
  pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
  local_40;
  
  (*appPat->mUnary)(&local_40,value);
  std::
  variant<std::monostate,mathiu::impl::Product_const*,int_const*,mathiu::impl::Fraction_const*,mathiu::impl::Power_const*,mathiu::impl::PieceWise_const*,bool,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>>
  ::operator=((variant<std::monostate,mathiu::impl::Product_const*,int_const*,mathiu::impl::Fraction_const*,mathiu::impl::Power_const*,mathiu::impl::PieceWise_const*,bool,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>>
               *)((context->mMemHolder)._M_elems + context->mSize),&local_40);
  context->mSize = context->mSize + 1;
  if (local_40.second.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.second.
               super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_40.first.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.first.
               super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  value_00 = std::
             get<7ul,std::monostate,mathiu::impl::Product_const*,int_const*,mathiu::impl::Fraction_const*,mathiu::impl::Power_const*,mathiu::impl::PieceWise_const*,bool,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>>
                       ((context->mMemHolder)._M_elems + (context->mSize - 1));
  eVar1 = matchPattern<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>,matchit::impl::Context<int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Product_const*,bool,mathiu::impl::Product_const*,bool,mathiu::impl::Product_const*,bool,mathiu::impl::Product_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Power_const*,bool,mathiu::impl::Power_const*,bool,mathiu::impl::PieceWise_const*,bool,mathiu::impl::PieceWise_const*,bool,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>>>
                    (value_00,&appPat->mPattern,depth + 1,context);
  return eVar1;
}

Assistant:

constexpr static auto matchPatternImpl(Value &&value,
                                                   App<Unary, Pattern> const &appPat,
                                                   int32_t depth, ContextT &context)
            {
                if constexpr (std::is_same_v<AppResultCurTuple<Value>, std::tuple<>>)
                {
                    return matchPattern(
                        std::forward<AppResult<Value>>(invoke_(appPat.unary(), value)),
                        appPat.pattern(), depth + 1, context);
                }
                else
                {
                    context.emplace_back(invoke_(appPat.unary(), value));
                    decltype(auto) result =
                        get<std::decay_t<AppResult<Value>>>(context.back());
                    return matchPattern(std::forward<AppResult<Value>>(result),
                                        appPat.pattern(), depth + 1, context);
                }
            }